

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoscbundle.cpp
# Opt level: O2

void __thiscall QOscBundle::QOscBundle(QOscBundle *this,QByteArray *data)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QOscMessage subMessage;
  QArrayDataPointer<char> local_b8;
  char *local_a0;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  quint32 parsedBytes;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_isValid = false;
  this->m_immediate = false;
  this->m_timeEpoch = 0;
  this->m_timePico = 0;
  (this->m_bundles).d.d = (Data *)0x0;
  (this->m_bundles).d.ptr = (QOscBundle *)0x0;
  (this->m_bundles).d.size = 0;
  (this->m_messages).d.d = (Data *)0x0;
  (this->m_messages).d.ptr = (QOscMessage *)0x0;
  (this->m_messages).d.size = 0;
  lcTuioBundle();
  if (((byte)lcTuioBundle::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    subMessage.m_isValid = true;
    subMessage._1_3_ = 0;
    subMessage._4_4_ = 0;
    subMessage.m_addressPattern.d.d._0_4_ = 0;
    subMessage.m_addressPattern.d.d._4_4_ = 0;
    subMessage.m_addressPattern.d.ptr._0_4_ = 0;
    subMessage.m_addressPattern.d.ptr._4_4_ = 0;
    subMessage.m_addressPattern.d.size = (qsizetype)lcTuioBundle::category.name;
    QMessageLogger::debug();
    QByteArray::toHex((char)&local_b8);
    QDebug::operator<<((QDebug *)&local_58,(QByteArray *)&local_b8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
    QDebug::~QDebug((QDebug *)&local_58);
  }
  parsedBytes = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.size = 0;
  bVar2 = qt_readOscString(data,(QByteArray *)&local_58,&parsedBytes);
  if (bVar2) {
    subMessage.m_isValid = true;
    subMessage._1_3_ = 0x10f0;
    subMessage._4_4_ = 0;
    bVar2 = operator!=((QByteArray *)&local_58,(char **)&subMessage);
    if (!bVar2) {
      lVar4 = (data->d).size;
      if ((parsedBytes <= (uint)lVar4) && (7 < (long)(lVar4 - (ulong)parsedBytes))) {
        pcVar5 = (data->d).ptr;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = (char *)&QByteArray::_empty;
        }
        uVar6 = *(uint *)(pcVar5 + parsedBytes);
        uVar7 = *(uint *)(pcVar5 + (parsedBytes + 4));
        bVar2 = uVar7 == 0x1000000 && uVar6 == 0;
        uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        parsedBytes = parsedBytes + 8;
        while( true ) {
          if (((uint)lVar4 <= parsedBytes) || ((long)(lVar4 - (ulong)parsedBytes) < 4))
          goto LAB_0010522a;
          pcVar5 = (data->d).ptr;
          if (pcVar5 == (char *)0x0) {
            pcVar5 = (char *)&QByteArray::_empty;
          }
          uVar1 = *(uint *)(pcVar5 + parsedBytes);
          uVar8 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          parsedBytes = parsedBytes + 4;
          if ((long)(lVar4 - (ulong)parsedBytes) < (long)(ulong)uVar8) goto LAB_0010522a;
          if (uVar1 == 0) break;
          local_78.size = -0x5555555555555556;
          local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_78.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          QByteArray::mid((longlong)&local_78,(longlong)data);
          parsedBytes = parsedBytes + uVar8;
          local_98.size = -0x5555555555555556;
          local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_98.ptr = (storage_type *)0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)&local_98,"#bundle",8);
          if ((local_78.size == 0) || (*local_78.ptr != '/')) {
            bv.m_data = local_98.ptr;
            bv.m_size = local_98.size;
            bVar3 = QByteArray::startsWith((QByteArray *)&local_78,bv);
            if (!bVar3) {
              lcTuioBundle();
              if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                  1) != 0) {
                subMessage.m_isValid = true;
                subMessage._1_3_ = 0;
                subMessage._4_4_ = 0;
                subMessage.m_addressPattern.d.d._0_4_ = 0;
                subMessage.m_addressPattern.d.d._4_4_ = 0;
                subMessage.m_addressPattern.d.ptr._0_4_ = 0;
                subMessage.m_addressPattern.d.ptr._4_4_ = 0;
                subMessage.m_addressPattern.d.size = (qsizetype)lcTuioBundle::category.name;
                QMessageLogger::warning(&subMessage.m_isValid,"Malformed sub-data!");
              }
              goto LAB_00105525;
            }
            subMessage.m_arguments.d.size = -0x5555555555555556;
            subMessage.m_arguments.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            subMessage.m_arguments.d.ptr = (QVariant *)0xaaaaaaaaaaaaaaaa;
            subMessage.m_addressPattern.d.ptr._0_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.ptr._4_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.size = -0x5555555555555556;
            subMessage.m_isValid = true;
            subMessage._1_3_ = 0xaaaaaa;
            subMessage._4_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.d._0_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.d._4_4_ = 0xaaaaaaaa;
            QOscBundle((QOscBundle *)&subMessage,(QByteArray *)&local_78);
            if (subMessage.m_isValid == true) {
              this->m_isValid = true;
              this->m_immediate = bVar2;
              this->m_timeEpoch = uVar6;
              this->m_timePico = uVar7;
              QList<QOscBundle>::emplaceBack<QOscBundle_const&>
                        (&this->m_bundles,(QOscBundle *)&subMessage);
            }
            ~QOscBundle((QOscBundle *)&subMessage);
          }
          else {
            subMessage.m_arguments.d.size = -0x5555555555555556;
            subMessage.m_arguments.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            subMessage.m_arguments.d.ptr = (QVariant *)0xaaaaaaaaaaaaaaaa;
            subMessage.m_addressPattern.d.ptr._0_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.ptr._4_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.size = -0x5555555555555556;
            subMessage.m_isValid = true;
            subMessage._1_3_ = 0xaaaaaa;
            subMessage._4_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.d._0_4_ = 0xaaaaaaaa;
            subMessage.m_addressPattern.d.d._4_4_ = 0xaaaaaaaa;
            QOscMessage::QOscMessage(&subMessage,(QByteArray *)&local_78);
            bVar3 = subMessage.m_isValid;
            if (subMessage.m_isValid == true) {
              this->m_isValid = true;
              this->m_immediate = bVar2;
              this->m_timeEpoch = uVar6;
              this->m_timePico = uVar7;
              QList<QOscMessage>::emplaceBack<QOscMessage_const&>(&this->m_messages,&subMessage);
            }
            else {
              lcTuioBundle();
              if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                  1) != 0) {
                local_b8.d._0_4_ = 2;
                local_b8._4_8_ = 0;
                local_b8._12_8_ = 0;
                local_b8.size._4_4_ = 0;
                local_a0 = lcTuioBundle::category.name;
                QMessageLogger::warning((char *)&local_b8,"Invalid sub-message");
              }
            }
            QOscMessage::~QOscMessage(&subMessage);
            if (bVar3 == false) {
LAB_00105525:
              QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
              QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
              goto LAB_0010522a;
            }
          }
          QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
          lVar4 = (data->d).size;
        }
        lcTuioBundle();
        if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
            0) {
          subMessage.m_isValid = true;
          subMessage._1_3_ = 0;
          subMessage._4_4_ = 0;
          subMessage.m_addressPattern.d.d._0_4_ = 0;
          subMessage.m_addressPattern.d.d._4_4_ = 0;
          subMessage.m_addressPattern.d.ptr._0_4_ = 0;
          subMessage.m_addressPattern.d.ptr._4_4_ = 0;
          subMessage.m_addressPattern.d.size = (qsizetype)lcTuioBundle::category.name;
          QMessageLogger::warning(&subMessage.m_isValid,"Empty bundle?");
        }
        this->m_isValid = true;
        this->m_immediate = bVar2;
        this->m_timeEpoch = uVar6;
        this->m_timePico = uVar7;
      }
    }
  }
LAB_0010522a:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOscBundle::QOscBundle(const QByteArray &data)
    : m_isValid(false)
    , m_immediate(false)
    , m_timeEpoch(0)
    , m_timePico(0)
{
    // 8  16 24 32 40 48 56 64
    // #  b  u  n  d  l  e  \0
    // 23 62 75 6e 64 6c 65 00 // OSC string bundle identifier
    // 00 00 00 00 00 00 00 01 // osc time-tag, "immediately"
    // 00 00 00 30 // element length
    //      => message or bundle(s), preceded by length each time
    qCDebug(lcTuioBundle) << data.toHex();
    quint32 parsedBytes = 0;

    // "An OSC Bundle consists of the OSC-string "#bundle""
    QByteArray identifier;
    if (!qt_readOscString(data, identifier, parsedBytes) || identifier != "#bundle")
        return;

    // "followed by an OSC Time
    // Tag, followed by zero or more OSC Bundle Elements. The OSC-timetag is a
    // 64-bit fixed point time tag whose semantics are described below."
    if (parsedBytes > (quint32)data.size() || data.size() - parsedBytes < qsizetype(sizeof(quint64)))
        return;

    // "Time tags are represented by a 64 bit fixed point number. The first 32
    // bits specify the number of seconds since midnight on January 1,  1900,
    // and the last 32 bits specify fractional parts of a second to a precision
    // of about 200 picoseconds. This is the representation used by Internet NTP
    // timestamps."
    //
    // (editor's note: one may wonder how a 64bit big-endian number can also be
    // two 32bit numbers, without specifying in which order they occur or
    // anything, and one may indeed continue to wonder.)
    quint32 oscTimeEpoch = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);
    quint32 oscTimePico = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);

    bool isImmediate = false;

    if (oscTimeEpoch == 0 && oscTimePico == 1) {
        // "The time tag value consisting of 63 zero bits followed by a
        // one in the least significant bit is a special case meaning
        // "immediately.""
        isImmediate = true;
    }

    while (parsedBytes < (quint32)data.size()) {
        // "An OSC Bundle Element consists of its size and its contents. The size is an
        // int32 representing the number of 8-bit bytes in the contents, and will
        // always be a multiple of 4."
        //
        // in practice, a bundle can contain multiple bundles or messages,
        // though, and each is prefixed by a size.
        if (data.size() - parsedBytes < qsizetype(sizeof(quint32)))
            return;

        quint32 size = qFromBigEndian<quint32>((const uchar*)data.constData() + parsedBytes);
        parsedBytes += sizeof(quint32);

        if (data.size() - parsedBytes < size)
            return;

        if (size == 0) {
            // empty bundle; these are valid, but should they be allowed? the
            // spec is unclear on this...
            qCWarning(lcTuioBundle, "Empty bundle?");
            m_isValid = true;
            m_immediate = isImmediate;
            m_timeEpoch = oscTimeEpoch;
            m_timePico = oscTimePico;
            return;
        }

        // "The contents are either an OSC Message or an OSC Bundle.
        // Note this recursive definition: bundle may contain bundles."
        QByteArray subdata = data.mid(parsedBytes, size);
        parsedBytes += size;

        // "The contents of an OSC packet must be either an OSC Message or an OSC Bundle.
        // The first byte of the packet's contents unambiguously distinguishes between
        // these two alternatives."
        //
        // we're not dealing with a packet here, but the same trick works just
        // the same.
        QByteArray bundleIdentifier = QByteArray("#bundle\0",  8);
        if (subdata.startsWith('/')) {
            // starts with / => address pattern => start of a message
            QOscMessage subMessage(subdata);
            if (subMessage.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_messages.append(subMessage);
            } else {
                qCWarning(lcTuioBundle, "Invalid sub-message");
                return;
            }
        } else if (subdata.startsWith(bundleIdentifier)) {
            // bundle identifier start => bundle
            QOscBundle subBundle(subdata);
            if (subBundle.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_bundles.append(subBundle);
            }
        } else {
            qCWarning(lcTuioBundle, "Malformed sub-data!");
            return;
        }
    }
}